

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

CTcSymbol * CTcSymObjBase::read_from_sym_file(CVmFile *fp)

{
  vm_obj_id_t obj_id;
  CTcPrsSymtab *this;
  tc_metaclass_t meta;
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  CTcSymbol *pCVar4;
  CTcSymObjBase *this_00;
  ulong uVar5;
  char *in_RSI;
  bool bVar6;
  char c;
  size_t sc_len;
  char buf [81];
  
  pcVar2 = CTcSymbolBase::base_read_from_sym_file(fp);
  if (pcVar2 == (char *)0x0) {
    this_00 = (CTcSymObjBase *)0x0;
  }
  else {
    meta = CVmFile::read_uint2(fp);
    if ((uint)(meta + TC_META_UNKNOWN) < 2) {
      this = G_prs->global_symtab_;
      sVar3 = strlen(pcVar2);
      in_RSI = pcVar2;
      pCVar4 = CTcPrsSymtab::find(this,pcVar2,sVar3);
      if (((pCVar4 != (CTcSymbol *)0x0) &&
          (*(int *)&(pCVar4->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
           == 2)) &&
         ((tc_metaclass_t)pCVar4[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_
          == meta)) {
        return pCVar4;
      }
    }
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)in_RSI);
    sVar3 = strlen(pcVar2);
    obj_id = G_cg->next_obj_;
    G_cg->next_obj_ = obj_id + 1;
    CTcSymObj::CTcSymObj((CTcSymObj *)this_00,pcVar2,sVar3,0,obj_id,1,meta,(CTcDictEntry *)0x0);
    if (meta == TC_META_TADSOBJ) {
      CVmFile::read_bytes(fp,&c,1);
      *(ushort *)&this_00->field_0xb8 =
           ((byte)c & 4) << 9 |
           (ushort)(((byte)c & 2) << 4) |
           (ushort)*(undefined4 *)&this_00->field_0xb8 & 0xfbdf | (ushort)(((byte)c & 1) << 10);
      uVar1 = CVmFile::read_uint2(fp);
      uVar5 = (ulong)uVar1;
      while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
        pcVar2 = CTcParser::read_len_prefix_str(fp,buf,0x51,&sc_len,0x2db6);
        add_sc_name_entry(this_00,pcVar2,sc_len);
      }
    }
  }
  return &this_00->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcSymObjBase::read_from_sym_file(CVmFile *fp)
{
    const char *txt;
    tc_metaclass_t meta;
    CTcSymObj *sym;
    char c;
    size_t cnt;
    size_t i;

    /* read the symbol name */
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the metaclass ID */
    meta = (tc_metaclass_t)fp->read_uint2();

    /* 
     *   If it's a dictionary object, check to see if it's already defined -
     *   a dictionary object can be exported from multiple modules without
     *   error, since dictionaries are shared across modules.
     *   
     *   The same applies to grammar productions, since a grammar production
     *   can be implicitly created in multiple files.  
     */
    if (meta == TC_META_DICT || meta == TC_META_GRAMPROD)
    {
        /* look for a previous instance of the symbol */
        CTcSymbol *old_sym =
            G_prs->get_global_symtab()->find(txt, strlen(txt));
        if (old_sym != 0
            && old_sym->get_type() == TC_SYM_OBJ
            && ((CTcSymObj *)old_sym)->get_metaclass() == meta)
        {
            /* 
             *   the dictionary is already in the symbol table - return the
             *   existing one, since there's no conflict with importing the
             *   dictionary from multiple places 
             */
            return old_sym;
        }
    }

    /* create the new symbol */
    sym = new CTcSymObj(txt, strlen(txt), FALSE, G_cg->new_obj_id(),
                        TRUE, meta, 0);

    /* if the metaclass is tads-object, read additional information */
    if (meta == TC_META_TADSOBJ)
    {
        /* read the root-object-superclass flag and the class-object flag */
        fp->read_bytes(&c, 1);
        sym->set_sc_is_root((c & 1) != 0);
        sym->set_is_class((c & 2) != 0);
        if ((c & 4) != 0)
            sym->set_transient();

        /* read the number of superclasses, and read the superclass names */
        cnt = fp->read_uint2();
        for (i = 0 ; i < cnt ; ++i)
        {
            char buf[TOK_SYM_MAX_LEN + 1];
            const char *sc_txt;
            size_t sc_len;

            /* read the symbol */
            sc_txt = CTcParser::read_len_prefix_str(
                fp, buf, sizeof(buf), &sc_len, TCERR_SYMEXP_SYM_TOO_LONG);

            /* add the superclass list entry to the symbol */
            sym->add_sc_name_entry(sc_txt, sc_len);
        }
    }

    /* return the symbol */
    return sym;
}